

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractByteBuffer.cpp
# Opt level: O0

bufsize_t __thiscall BufferView::getContentSize(BufferView *this)

{
  int iVar1;
  undefined4 extraout_var;
  bufsize_t trimedSize;
  bufsize_t maxSize;
  BufferView *this_local;
  ulong uVar2;
  
  iVar1 = (*this->parent->_vptr_AbstractByteBuffer[2])();
  uVar2 = CONCAT44(extraout_var,iVar1);
  if (uVar2 < this->offset) {
    this_local = (BufferView *)0x0;
  }
  else if (uVar2 < this->offset + this->size) {
    this_local = (BufferView *)(uVar2 - this->offset);
  }
  else {
    this_local = (BufferView *)this->size;
  }
  return (bufsize_t)this_local;
}

Assistant:

bufsize_t BufferView::getContentSize()
{
    bufsize_t maxSize = this->parent->getContentSize();
    if (offset > maxSize) {
        return 0;
    }
    if (offset + size > maxSize) {
        bufsize_t trimedSize = maxSize - offset;
        return trimedSize;
    }
    return size;
}